

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O1

shared_ptr<const_calc4::Operator> __thiscall
calc4::Optimize<__int128>
          (calc4 *this,CompilationContext *context,shared_ptr<const_calc4::Operator> *op)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Self __tmp;
  shared_ptr<const_calc4::Operator> sVar3;
  shared_ptr<const_calc4::Operator> optimized;
  anon_unknown_23 local_78 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  OperatorImplement local_68;
  
  p_Var2 = (context->userDefinedOperators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(context->userDefinedOperators)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var1) {
    do {
      anon_unknown_23::OptimizeCore<__int128>
                (local_78,context,(shared_ptr<const_calc4::Operator> *)&p_Var2[3]._M_parent);
      OperatorImplement::OperatorImplement
                (&local_68,(OperatorDefinition *)(p_Var2 + 2),
                 (shared_ptr<const_calc4::Operator> *)local_78);
      CompilationContext::AddOperatorImplement(context,&local_68);
      if (local_68.op.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.op.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.definition.name._M_dataplus._M_p != &local_68.definition.name.field_2) {
        operator_delete(local_68.definition.name._M_dataplus._M_p,
                        local_68.definition.name.field_2._M_allocated_capacity + 1);
      }
      if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
  }
  sVar3 = anon_unknown_23::OptimizeCore<__int128>((anon_unknown_23 *)this,context,op);
  sVar3.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_calc4::Operator>)
         sVar3.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const Operator> Optimize(CompilationContext& context,
                                         const std::shared_ptr<const Operator>& op)
{
    for (auto it = context.UserDefinedOperatorBegin(); it != context.UserDefinedOperatorEnd(); it++)
    {
        std::shared_ptr<const Operator> optimized =
            OptimizeCore<TNumber>(context, it->second.GetOperator());
        context.AddOperatorImplement(
            OperatorImplement(it->second.GetDefinition(), std::move(optimized)));
    }

    return OptimizeCore<TNumber>(context, op);
}